

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<kj::Repeat<char>,kj::CappedArray<char,14ul>&,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,Repeat<char> *params,
          CappedArray<char,_14UL> *params_1,char (*params_2) [2])

{
  Repeat<char> *value;
  CappedArray<char,_14UL> *value_00;
  char (*value_01) [2];
  Repeat<char> RVar1;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char local_38;
  char *local_30;
  CappedArray<char,_14UL> *local_28;
  char (*params_local_2) [2];
  CappedArray<char,_14UL> *params_local_1;
  Repeat<char> *params_local;
  
  local_28 = params_1;
  params_local_2 = &params->value;
  params_local_1 = (CappedArray<char,_14UL> *)this;
  params_local = (Repeat<char> *)__return_storage_ptr__;
  value = fwd<kj::Repeat<char>>((NoInfer<kj::Repeat<char>_> *)this);
  RVar1 = _::toStringTreeOrCharSequence<kj::Repeat<char>>(value);
  local_30 = (char *)RVar1.count;
  local_38 = RVar1.value;
  value_00 = fwd<kj::CappedArray<char,14ul>&>((CappedArray<char,_14UL> *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::CappedArray<char,14ul>&>(value_00);
  value_01 = ::const((char (*) [2])local_28);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_01);
  StringTree::concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,(Repeat<char> *)&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}